

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O2

Expression * __thiscall MathInterpreter::interpret(MathInterpreter *this,string *input_arg)

{
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  Expression *pEVar1;
  _List_node_base *p_Var2;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)input_arg);
  separateInput(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  fromInfixToPostfix(this);
  pEVar1 = fromStringToExpression(this);
  this_00 = &this->input->
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  if (this_00 !=
      (_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(this_00);
  }
  operator_delete(this_00,0x18);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2->_M_prev = p_Var2;
  p_Var2->_M_next = p_Var2;
  p_Var2[1]._M_next = (_List_node_base *)0x0;
  this->input = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)p_Var2;
  return pEVar1;
}

Assistant:

Expression *MathInterpreter::interpret(string input_arg) {
  this->separateInput(input_arg);
  this->fromInfixToPostfix();
  Expression *e = this->fromStringToExpression();
  delete this->input;
  this->input = new list<string>();
  return e;
}